

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall
QXmlStreamWriter::writeTextElement
          (QXmlStreamWriter *this,QAnyStringView namespaceUri,QAnyStringView name,
          QAnyStringView text)

{
  _Head_base<0UL,_QXmlStreamWriterPrivate_*,_false> this_00;
  
  QXmlStreamWriterPrivate::writeStartElement
            ((this->d_ptr)._M_t.
             super___uniq_ptr_impl<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_QXmlStreamWriterPrivate_*,_std::default_delete<QXmlStreamWriterPrivate>_>
             .super__Head_base<0UL,_QXmlStreamWriterPrivate_*,_false>._M_head_impl,namespaceUri,name
             ,KeepEverything);
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamWriterPrivate_*,_std::default_delete<QXmlStreamWriterPrivate>_>
       .super__Head_base<0UL,_QXmlStreamWriterPrivate_*,_false>._M_head_impl;
  QXmlStreamWriterPrivate::finishStartElement(this_00._M_head_impl,true);
  QXmlStreamWriterPrivate::writeEscaped(this_00._M_head_impl,text,false);
  writeEndElement(this);
  return;
}

Assistant:

void QXmlStreamWriter::writeTextElement(QAnyStringView namespaceUri, QAnyStringView name, QAnyStringView text)
{
    writeStartElement(namespaceUri, name);
    writeCharacters(text);
    writeEndElement();
}